

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O3

void socket_accept_thin_client(void *cmv,void *sockv)

{
  int __fd;
  int iVar1;
  undefined8 *param2;
  undefined8 uVar2;
  undefined8 *puVar3;
  linger linger_val;
  sockaddr sock_addr;
  undefined4 local_48;
  undefined8 local_44;
  socklen_t local_3c;
  sockaddr local_38;
  
  local_44 = 0x3c00000001;
  __fd = accept((int)sockv,(sockaddr *)0x0,(socklen_t *)0x0);
  if (__fd == -1) {
    socket_accept_thin_client_cold_1();
  }
  else {
    local_48 = 1;
    setsockopt(__fd,1,9,&local_48,4);
    iVar1 = setsockopt(__fd,1,0xd,&local_44,8);
    if (iVar1 == 0) {
      local_3c = 0x10;
      local_38.sa_family = 0;
      local_38.sa_data[0] = '\0';
      local_38.sa_data[1] = '\0';
      local_38.sa_data[2] = '\0';
      local_38.sa_data[3] = '\0';
      local_38.sa_data[4] = '\0';
      local_38.sa_data[5] = '\0';
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      getsockname(__fd,&local_38,&local_3c);
      local_38.sa_family = 0;
      local_38.sa_data[0] = '\0';
      local_38.sa_data[1] = '\0';
      local_38.sa_data[2] = '\0';
      local_38.sa_data[3] = '\0';
      local_38.sa_data[4] = '\0';
      local_38.sa_data[5] = '\0';
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_3c = 0x10;
      getpeername(__fd,&local_38,&local_3c);
      param2 = (undefined8 *)INT_CMmalloc(0x30);
      *param2 = 0;
      param2[1] = 0;
      param2[2] = 0;
      param2[3] = 0;
      param2[4] = 0;
      param2[5] = 0;
      uVar2 = open_FFSfd((long)__fd,"r");
      *param2 = uVar2;
      *(int *)(param2 + 1) = __fd;
      puVar3 = (undefined8 *)INT_CMmalloc(8);
      param2[5] = puVar3;
      *puVar3 = 0;
      INT_CM_fd_add_select((CManager_conflict)cmv,__fd,thin_data_available,cmv,param2);
    }
    else {
      perror("set SO_LINGER");
    }
  }
  return;
}

Assistant:

static void
socket_accept_thin_client(void *cmv, void * sockv)
{
    CManager cm = (CManager) cmv;
    SOCKET conn_sock = (int) (intptr_t)sockv;
    SOCKET sock;
    struct sockaddr sock_addr;
    unsigned int sock_len = sizeof(sock_addr);
    int int_port_num;
    struct linger linger_val;
    int sock_opt_val = 1;
    thin_conn_data cd;

#ifdef TCP_NODELAY
    int delay_value = 1;
#endif

    linger_val.l_onoff = 1;
    linger_val.l_linger = 60;
    if ((sock = accept(conn_sock, (struct sockaddr *) 0, (unsigned int *) 0)) == SOCKET_ERROR) {
	perror("Cannot accept socket connection");
	CM_fd_remove_select(cm, conn_sock);
	fprintf(stderr, "failure in CMsockets  removing socket connection\n");
	return;
    }
    sock_opt_val = 1;
    setsockopt(sock, SOL_SOCKET, SO_KEEPALIVE, (char *) &sock_opt_val,
	       sizeof(sock_opt_val));
    if (setsockopt(sock, SOL_SOCKET, SO_LINGER, (char *) &linger_val,
		   sizeof(struct linger)) != 0) {
	perror("set SO_LINGER");
	return;
    }
#ifdef TCP_NODELAY
    setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char *) &delay_value,
	       sizeof(delay_value));
#endif

    sock_len = sizeof(sock_addr);
    memset(&sock_addr, 0, sock_len);
    getsockname(sock, (struct sockaddr *) &sock_addr, &sock_len);
    int_port_num = (unsigned short) ntohs(((struct sockaddr_in *) &sock_addr)->sin_port);

    memset(&sock_addr, 0, sizeof(sock_addr));
    sock_len = sizeof(sock_addr);
    if (getpeername(sock, &sock_addr,
		    &sock_len) == 0) {
	int_port_num = (unsigned short) ntohs(((struct sockaddr_in *) &sock_addr)->sin_port);
    }

    (void) int_port_num;
    cd = malloc(sizeof(*cd));
    memset(cd, 0, sizeof(*cd));
    cd->ffsfile = open_FFSfd((void*)(intptr_t)sock, "r");
    cd->fd = sock;
    cd->src_list = malloc(sizeof(cd->src_list[0]));
    cd->src_list[0] = NULL;
    INT_CM_fd_add_select(cm, sock,
		     (void (*)(void *, void *)) thin_data_available,
		       (void *) cm, (void *) cd);
}